

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall
QMainWindowLayout::restoreDockWidget(QMainWindowLayout *this,QDockWidget *dockwidget)

{
  bool bVar1;
  QMainWindowLayout *in_RSI;
  QWidget *in_RDI;
  QWidget *in_stack_00000008;
  QDockWidget *in_stack_00000048;
  QDockAreaLayout *in_stack_00000050;
  
  QLayout::addChildWidget((QLayout *)dockwidget,in_stack_00000008);
  bVar1 = QDockAreaLayout::restoreDockWidget(in_stack_00000050,in_stack_00000048);
  if (bVar1) {
    dockWidgetArea(in_RSI,in_RDI);
    QDockWidget::dockLocationChanged
              ((QDockWidget *)0x5f6a01,(DockWidgetArea)((ulong)in_RSI >> 0x20));
    (**(code **)(*(long *)in_RDI + 0x70))();
  }
  return bVar1;
}

Assistant:

bool QMainWindowLayout::restoreDockWidget(QDockWidget *dockwidget)
{
    addChildWidget(dockwidget);
    if (!layoutState.dockAreaLayout.restoreDockWidget(dockwidget))
        return false;
    emit dockwidget->dockLocationChanged(dockWidgetArea(dockwidget));
    invalidate();
    return true;
}